

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriter::AddReloc(BinaryWriter *this,RelocType reloc_type,Index index)

{
  pointer *ppRVar1;
  undefined8 *puVar2;
  Index IVar3;
  pointer pRVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  pointer pRVar8;
  pointer pRVar9;
  pointer puVar10;
  pointer puVar11;
  pointer pRVar12;
  ulong uVar13;
  pointer pRVar14;
  ulong uVar15;
  Index symbol_index;
  size_t offset;
  RelocType local_48;
  Index local_44;
  pointer local_40;
  unsigned_long local_38;
  
  local_48 = reloc_type;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    pcVar5 = GetSectionName(this->last_section_type_);
    pRVar4 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar4 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar12 = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pRVar4 - (long)pRVar12 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar6 = (long)pRVar4 - (long)pRVar12 >> 3;
      uVar13 = lVar6 * -0x3333333333333333;
      uVar7 = 1;
      if (pRVar4 != pRVar12) {
        uVar7 = uVar13;
      }
      uVar15 = uVar7 + uVar13;
      if (0x333333333333332 < uVar15) {
        uVar15 = 0x333333333333333;
      }
      if (CARRY8(uVar7,uVar13)) {
        uVar15 = 0x333333333333333;
      }
      if (uVar15 == 0) {
        pRVar8 = (pointer)0x0;
      }
      else {
        local_40 = pRVar12;
        pRVar8 = (pointer)operator_new(uVar15 * 0x28);
        pRVar12 = local_40;
      }
      IVar3 = this->section_count_;
      (&pRVar8->name)[lVar6] = pcVar5;
      (&pRVar8->section_index)[lVar6 * 2] = IVar3;
      puVar2 = (undefined8 *)
               ((long)&(pRVar8->relocations).
                       super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl +
               lVar6 * 8);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)
       ((long)&(pRVar8->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
               _M_impl + lVar6 * 8 + 0x10) = 0;
      pRVar14 = pRVar8;
      for (pRVar9 = pRVar12; pRVar4 != pRVar9; pRVar9 = pRVar9 + 1) {
        pRVar14->section_index = pRVar9->section_index;
        pRVar14->name = pRVar9->name;
        (pRVar14->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(pRVar14->relocations).
                 super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl + 8) =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(pRVar14->relocations).
                 super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl + 0x10) =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pRVar14 = pRVar14 + 1;
      }
      if (pRVar12 != (pointer)0x0) {
        operator_delete(pRVar12,(long)(this->reloc_sections_).
                                      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pRVar12);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar8;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar14 + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar8 + uVar15;
    }
    else {
      IVar3 = this->section_count_;
      pRVar4->name = pcVar5;
      pRVar4->section_index = IVar3;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppRVar1 = &(this->reloc_sections_).
                 super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
    this->current_reloc_section_ =
         (this->reloc_sections_).
         super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  local_38 = this->stream_->offset_ - this->last_section_payload_offset_;
  if ((int)local_48 < 7) {
    if (local_48 != First) {
      if (local_48 == TypeIndexLEB) goto LAB_001557a3;
LAB_001557d8:
      _GLOBAL__N_1::BinaryWriter::AddReloc((BinaryWriter *)(ulong)local_48);
      index = 0xffffffff;
      goto LAB_001557a3;
    }
    puVar10 = (this->symtab_).functions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar11 = (this->symtab_).functions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else if (local_48 == GlobalIndexLEB) {
    puVar10 = (this->symtab_).globals_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar11 = (this->symtab_).globals_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  else {
    if (local_48 != TableNumberLEB) goto LAB_001557d8;
    puVar10 = (this->symtab_).tables_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar11 = (this->symtab_).tables_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  uVar7 = (ulong)index;
  index = 0xffffffff;
  if (uVar7 < (ulong)((long)puVar11 - (long)puVar10 >> 2)) {
    index = puVar10[uVar7];
  }
LAB_001557a3:
  if (index != 0xffffffff) {
    local_44 = index;
    std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
    emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
              ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
               &this->current_reloc_section_->relocations,&local_48,&local_38,&local_44);
  }
  return;
}

Assistant:

void BinaryWriter::AddReloc(RelocType reloc_type, Index index) {
  // Add a new reloc section if needed
  if (!current_reloc_section_ ||
      current_reloc_section_->section_index != section_count_) {
    reloc_sections_.emplace_back(GetSectionName(last_section_type_),
                                 section_count_);
    current_reloc_section_ = &reloc_sections_.back();
  }

  // Add a new relocation to the curent reloc section
  size_t offset = stream_->offset() - last_section_payload_offset_;
  Index symbol_index = GetSymbolIndex(reloc_type, index);
  if (symbol_index == kInvalidIndex) {
    // The file is invalid, for example a reference to function 42 where only 10
    // functions are defined.  The user must have already passed --no-check, so
    // no extra warning here is needed.
    return;
  }
  current_reloc_section_->relocations.emplace_back(reloc_type, offset,
                                                   symbol_index);
}